

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_hash.cc
# Opt level: O0

uint64_t absl::lts_20240722::hash_internal::LowLevelHashLenGt16
                   (void *data,size_t len,uint64_t seed,uint64_t *salt)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t b;
  uint64_t a;
  uint64_t b_3;
  uint64_t a_3;
  uint64_t cs1;
  uint64_t cs0;
  uint64_t d_1;
  uint64_t c_1;
  uint64_t b_2;
  uint64_t a_2;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t d;
  uint64_t c;
  uint64_t b_1;
  uint64_t a_1;
  uint64_t duplicated_state2;
  uint64_t duplicated_state1;
  uint64_t duplicated_state0;
  uint64_t current_state;
  uint8_t *last_16_ptr;
  uint64_t starting_length;
  uint8_t *ptr;
  uint64_t *salt_local;
  uint64_t seed_local;
  size_t len_local;
  void *data_local;
  
  a_1 = seed ^ *salt;
  duplicated_state2 = a_1;
  duplicated_state1 = a_1;
  duplicated_state0 = a_1;
  starting_length = (uint64_t)data;
  seed_local = len;
  if (0x40 < len) {
    do {
      uVar1 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)starting_length);
      uVar2 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 8));
      uVar3 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 0x10));
      uVar4 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 0x18));
      uVar5 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 0x20));
      uVar6 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 0x28));
      uVar7 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 0x30));
      uVar8 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 0x38));
      duplicated_state0 = Mix(uVar1 ^ salt[1],uVar2 ^ duplicated_state0);
      duplicated_state1 = Mix(uVar3 ^ salt[2],uVar4 ^ duplicated_state1);
      duplicated_state2 = Mix(uVar5 ^ salt[3],uVar6 ^ duplicated_state2);
      a_1 = Mix(uVar7 ^ salt[4],uVar8 ^ a_1);
      starting_length = starting_length + 0x40;
      seed_local = seed_local - 0x40;
    } while (0x40 < seed_local);
    duplicated_state0 = duplicated_state0 ^ duplicated_state1 ^ duplicated_state2 + a_1;
  }
  if (0x20 < seed_local) {
    uVar1 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)starting_length);
    uVar2 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 8));
    uVar3 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 0x10));
    uVar4 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 0x18));
    uVar1 = Mix(uVar1 ^ salt[1],uVar2 ^ duplicated_state0);
    uVar2 = Mix(uVar3 ^ salt[2],uVar4 ^ duplicated_state0);
    duplicated_state0 = uVar1 ^ uVar2;
    starting_length = starting_length + 0x20;
    seed_local = seed_local - 0x20;
  }
  if (0x10 < seed_local) {
    uVar1 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)starting_length);
    uVar2 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)(starting_length + 8));
    duplicated_state0 = Mix(uVar1 ^ salt[1],uVar2 ^ duplicated_state0);
  }
  uVar1 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)((long)data + (len - 0x10)));
  uVar2 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)((long)data + (len - 8)));
  uVar1 = Mix(uVar1 ^ salt[1] ^ len,uVar2 ^ duplicated_state0);
  return uVar1;
}

Assistant:

uint64_t LowLevelHashLenGt16(const void* data, size_t len, uint64_t seed,
                             const uint64_t salt[5]) {
  // Prefetch the cacheline that data resides in.
  PrefetchToLocalCache(data);
  const uint8_t* ptr = static_cast<const uint8_t*>(data);
  uint64_t starting_length = static_cast<uint64_t>(len);
  const uint8_t* last_16_ptr = ptr + starting_length - 16;
  uint64_t current_state = seed ^ salt[0];

  if (len > 64) {
    // If we have more than 64 bytes, we're going to handle chunks of 64
    // bytes at a time. We're going to build up two separate hash states
    // which we will then hash together.
    uint64_t duplicated_state0 = current_state;
    uint64_t duplicated_state1 = current_state;
    uint64_t duplicated_state2 = current_state;

    do {
      // Always prefetch the next cacheline.
      PrefetchToLocalCache(ptr + ABSL_CACHELINE_SIZE);

      uint64_t a = absl::base_internal::UnalignedLoad64(ptr);
      uint64_t b = absl::base_internal::UnalignedLoad64(ptr + 8);
      uint64_t c = absl::base_internal::UnalignedLoad64(ptr + 16);
      uint64_t d = absl::base_internal::UnalignedLoad64(ptr + 24);
      uint64_t e = absl::base_internal::UnalignedLoad64(ptr + 32);
      uint64_t f = absl::base_internal::UnalignedLoad64(ptr + 40);
      uint64_t g = absl::base_internal::UnalignedLoad64(ptr + 48);
      uint64_t h = absl::base_internal::UnalignedLoad64(ptr + 56);

      current_state = Mix(a ^ salt[1], b ^ current_state);
      duplicated_state0 = Mix(c ^ salt[2], d ^ duplicated_state0);

      duplicated_state1 = Mix(e ^ salt[3], f ^ duplicated_state1);
      duplicated_state2 = Mix(g ^ salt[4], h ^ duplicated_state2);

      ptr += 64;
      len -= 64;
    } while (len > 64);

    current_state = (current_state ^ duplicated_state0) ^
                    (duplicated_state1 + duplicated_state2);
  }

  // We now have a data `ptr` with at most 64 bytes and the current state
  // of the hashing state machine stored in current_state.
  if (len > 32) {
    uint64_t a = absl::base_internal::UnalignedLoad64(ptr);
    uint64_t b = absl::base_internal::UnalignedLoad64(ptr + 8);
    uint64_t c = absl::base_internal::UnalignedLoad64(ptr + 16);
    uint64_t d = absl::base_internal::UnalignedLoad64(ptr + 24);

    uint64_t cs0 = Mix(a ^ salt[1], b ^ current_state);
    uint64_t cs1 = Mix(c ^ salt[2], d ^ current_state);
    current_state = cs0 ^ cs1;

    ptr += 32;
    len -= 32;
  }

  // We now have a data `ptr` with at most 32 bytes and the current state
  // of the hashing state machine stored in current_state.
  if (len > 16) {
    uint64_t a = absl::base_internal::UnalignedLoad64(ptr);
    uint64_t b = absl::base_internal::UnalignedLoad64(ptr + 8);

    current_state = Mix(a ^ salt[1], b ^ current_state);
  }

  // We now have a data `ptr` with at least 1 and at most 16 bytes. But we can
  // safely read from `ptr + len - 16`.
  uint64_t a = absl::base_internal::UnalignedLoad64(last_16_ptr);
  uint64_t b = absl::base_internal::UnalignedLoad64(last_16_ptr + 8);

  return Mix(a ^ salt[1] ^ starting_length, b ^ current_state);
}